

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)3>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  RandomEngine *this_00;
  SelectionVector *sel_vector;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double *pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  BlockManager *pBVar5;
  pointer pSVar6;
  size_type __n;
  data_ptr_t pdVar7;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var8;
  ScanFilterInfo *pSVar9;
  bool bVar10;
  bool bVar11;
  FilterPropagateResult FVar12;
  int iVar13;
  idx_t iVar14;
  const_reference pvVar15;
  ColumnData *pCVar16;
  AdaptiveFilterState state_00;
  AdaptiveFilter *this_01;
  reference pvVar17;
  const_reference pvVar18;
  type filter_state;
  reference pvVar19;
  ulong uVar20;
  const_iterator __begin5;
  pointer pSVar21;
  idx_t max_count;
  ulong uVar22;
  element_type *peVar23;
  idx_t i;
  ulong uVar24;
  idx_t i_2;
  long lVar25;
  double dVar26;
  optional_ptr<duckdb::DuckTransaction,_true> in_stack_fffffffffffffea8;
  idx_t approved_tuple_count;
  DataChunk *local_118;
  element_type *local_110;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __atomic_base<unsigned_long> local_100;
  idx_t local_f8;
  vector<duckdb::StorageIndex,_true> *local_f0;
  SelectionVector sel;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state->parent;
  local_f0 = &((TableScanState *)local_108._M_pi)->column_ids;
  local_100._M_i = (__int_type)&((TableScanState *)local_108._M_pi)->filters;
  this_00 = &state->random;
  sel_vector = &state->valid_sel;
  pSVar9 = &((TableScanState *)local_108._M_pi)->filters;
  local_118 = result;
  local_110 = (element_type *)state;
  do {
    p_Var3 = (((element_type *)state)->super_enable_shared_from_this<duckdb::ClientContext>).
             __weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar4 = (((element_type *)state)->db).internal.
             super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar23 = (element_type *)((long)p_Var3 * 0x800);
    max_count = (long)peVar4 + (long)p_Var3 * -0x800;
    if (peVar4 < peVar23 || max_count == 0) {
      return;
    }
    if (0x7ff < max_count) {
      max_count = 0x800;
    }
    if (((((TableScanState *)(((element_type *)state)->config).profiler_settings._M_h._M_buckets)->
         sampling_info).do_system_sample != true) ||
       (dVar26 = RandomEngine::NextRandom(this_00),
       pdVar2 = &(((TableScanState *)
                  (((element_type *)state)->config).profiler_settings._M_h._M_buckets)->
                 sampling_info).sample_rate, dVar26 < *pdVar2 || dVar26 == *pdVar2)) {
      bVar10 = CheckZonemapSegments(this,state);
      bVar11 = true;
      if (bVar10) {
        iVar14 = GetCommittedSelVector
                           ((RowGroup *)
                            (((element_type *)state)->
                            super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                            internal.
                            super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,transaction.start_time,transaction.transaction_id,
                            (idx_t)(((element_type *)state)->
                                   super_enable_shared_from_this<duckdb::ClientContext>).
                                   __weak_this_.internal.
                                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,sel_vector,max_count);
        if (iVar14 == 0) goto LAB_01568250;
        pBVar5 = ((this->collection)._M_data)->block_manager;
        local_f8 = iVar14;
        iVar13 = (*pBVar5->_vptr_BlockManager[0x12])(pBVar5);
        if ((char)iVar13 != '\0') {
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar25 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)local_108._M_pi[0x1c]._vptr__Sp_counted_base -
                               *(long *)&local_108._M_pi[0x1b]._M_use_count >> 5);
              uVar24 = uVar24 + 1) {
            pvVar15 = vector<duckdb::StorageIndex,_true>::get<true>(local_f0,uVar24);
            if (pvVar15->index != 0xffffffffffffffff) {
              pCVar16 = GetColumn(this,pvVar15);
              (*pCVar16->_vptr_ColumnData[6])
                        (pCVar16,&prefetch_state,
                         (long)&((((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                    *)&(((element_type *)state)->db).internal.
                                       super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_t).
                                 super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                _M_head_impl)->current + lVar25,max_count);
            }
            lVar25 = lVar25 + 0x98;
          }
          (*pBVar5->buffer_manager->_vptr_BufferManager[8])(pBVar5->buffer_manager,&prefetch_state);
          PrefetchState::~PrefetchState(&prefetch_state);
        }
        bVar11 = ScanFilterInfo::HasFilters((ScanFilterInfo *)local_100._M_i);
        if (local_f8 == max_count && !bVar11) {
          lVar25 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)local_108._M_pi[0x1c]._vptr__Sp_counted_base -
                               *(long *)&local_108._M_pi[0x1b]._M_use_count >> 5);
              uVar24 = uVar24 + 1) {
            pvVar15 = vector<duckdb::StorageIndex,_true>::get<true>(local_f0,uVar24);
            if (pvVar15->index == 0xffffffffffffffff) {
              pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,uVar24);
              Vector::Sequence(pvVar19,(long)&(peVar23->
                                              super_enable_shared_from_this<duckdb::DatabaseInstance>
                                              ).__weak_this_.internal.
                                              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr +
                                       (this->super_SegmentBase<duckdb::RowGroup>).start,1,max_count
                              );
            }
            else {
              pCVar16 = GetColumn(this,pvVar15);
              p_Var3 = (local_110->super_enable_shared_from_this<duckdb::ClientContext>).
                       __weak_this_.internal.
                       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              _Var8._M_head_impl =
                   (((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                      *)&(local_110->db).internal.
                         super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_t).
                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
              pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,uVar24);
              state = (CollectionScanState *)local_110;
              ColumnData::ScanCommitted
                        (pCVar16,(idx_t)p_Var3,
                         (ColumnScanState *)((long)&(_Var8._M_head_impl)->current + lVar25),pvVar19,
                         false);
            }
            lVar25 = lVar25 + 0x98;
          }
LAB_015687dd:
          local_f8 = max_count;
          local_118->count = local_f8;
          p_Var1 = &(((element_type *)state)->super_enable_shared_from_this<duckdb::ClientContext>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          p_Var1->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
          return;
        }
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        approved_tuple_count = local_f8;
        sel.sel_vector = (sel_t *)0x0;
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if (local_f8 == max_count) {
          ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
                     &sel.selection_data);
          sel.sel_vector = (sel_t *)0x0;
        }
        else {
          SelectionVector::Initialize(&sel,sel_vector);
        }
        adaptive_filter.ptr =
             (((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_> *)
              &local_108._M_pi[0x13]._vptr__Sp_counted_base)->_M_t).
             super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
             .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
        state_00 = ScanFilterInfo::BeginFilter((ScanFilterInfo *)local_100._M_i);
        if (bVar11) {
          uVar24 = 0;
          while( true ) {
            pSVar21 = (((vector<duckdb::ScanFilter,_true> *)&local_108._M_pi[0x13]._M_use_count)->
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>).
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar6 = (pointer)local_108._M_pi[0x14]._vptr__Sp_counted_base;
            if ((ulong)(((long)pSVar6 - (long)pSVar21) / 0x28) <= uVar24) break;
            this_01 = optional_ptr<duckdb::AdaptiveFilter,_true>::operator->(&adaptive_filter);
            pvVar17 = vector<unsigned_long,_true>::get<true>(&this_01->permutation,uVar24);
            pvVar18 = vector<duckdb::ScanFilter,_true>::get<true>(&pSVar9->filter_list,*pvVar17);
            if (pvVar18->always_true == false) {
              filter_state = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                             ::operator*(&pvVar18->filter_state);
              __n = pvVar18->scan_column_index;
              iVar14 = pvVar18->table_column_index;
              pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,__n);
              if (iVar14 == 0xffffffffffffffff) {
                iVar14 = (long)&(peVar23->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + (this->super_SegmentBase<duckdb::RowGroup>).start;
                FVar12 = CheckRowIdFilter(pvVar18->filter,iVar14,iVar14 + max_count);
                state = (CollectionScanState *)local_110;
                if (FVar12 == FILTER_ALWAYS_FALSE) {
                  approved_tuple_count = 0;
                }
                else {
                  Vector::SetVectorType(pvVar19,FLAT_VECTOR);
                  pdVar7 = pvVar19->data;
                  for (uVar20 = 0; uVar20 < approved_tuple_count; uVar20 = uVar20 + 1) {
                    uVar22 = uVar20;
                    if (sel.sel_vector != (sel_t *)0x0) {
                      uVar22 = (ulong)sel.sel_vector[uVar20];
                    }
                    *(ulong *)(pdVar7 + uVar22 * 8) =
                         (long)&(peVar23->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + uVar22 + (this->super_SegmentBase<duckdb::RowGroup>).start
                    ;
                  }
                  if (FVar12 != FILTER_ALWAYS_TRUE) {
                    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&prefetch_state)
                    ;
                    Vector::ToUnifiedFormat
                              (pvVar19,approved_tuple_count,(UnifiedVectorFormat *)&prefetch_state);
                    in_stack_fffffffffffffea8.ptr = (DuckTransaction *)&approved_tuple_count;
                    ColumnSegment::FilterSelection
                              (&sel,pvVar19,(UnifiedVectorFormat *)&prefetch_state,pvVar18->filter,
                               filter_state,approved_tuple_count,
                               (idx_t *)in_stack_fffffffffffffea8.ptr);
                    UnifiedVectorFormat::~UnifiedVectorFormat
                              ((UnifiedVectorFormat *)&prefetch_state);
                  }
                }
              }
              else {
                pCVar16 = GetColumn(this,pvVar18->table_column_index);
                state = (CollectionScanState *)local_110;
                in_stack_fffffffffffffea8.ptr = transaction.transaction.ptr;
                (*pCVar16->_vptr_ColumnData[0xd])
                          (pCVar16,(local_110->super_enable_shared_from_this<duckdb::ClientContext>)
                                   .__weak_this_.internal.
                                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi,
                           (((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                              *)&(local_110->db).internal.
                                 super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_M_t).
                           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl +
                           __n,pvVar19,&sel,&approved_tuple_count,transaction.transaction.ptr,
                           transaction.transaction_id,transaction.start_time,pvVar18->filter,
                           filter_state);
              }
            }
            uVar24 = uVar24 + 1;
          }
          for (; pSVar21 != pSVar6; pSVar21 = pSVar21 + 1) {
            if (pSVar21->always_true == false) {
              pvVar19 = vector<duckdb::Vector,_true>::get<true>
                                  (&local_118->data,pSVar21->scan_column_index);
              Vector::Slice(pvVar19,&sel,approved_tuple_count);
            }
          }
        }
        iVar14 = approved_tuple_count;
        if (approved_tuple_count == 0) {
          DataChunk::Reset(local_118);
          lVar25 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)local_108._M_pi[0x1c]._vptr__Sp_counted_base -
                               *(long *)&local_108._M_pi[0x1b]._M_use_count >> 5);
              uVar24 = uVar24 + 1) {
            pvVar15 = vector<duckdb::StorageIndex,_true>::get<true>(local_f0,uVar24);
            if ((pvVar15->index != 0xffffffffffffffff) &&
               ((!bVar11 ||
                (bVar10 = ScanFilterInfo::ColumnHasFilters((ScanFilterInfo *)local_100._M_i,uVar24),
                !bVar10)))) {
              pCVar16 = GetColumn(this,pvVar15);
              (*pCVar16->_vptr_ColumnData[0x10])
                        (pCVar16,(long)&((((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                            *)&(((element_type *)state)->db).internal.
                                               super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi)->_M_t).
                                         super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                        _M_head_impl)->current + lVar25,0x800);
            }
            lVar25 = lVar25 + 0x98;
          }
          p_Var1 = &(((element_type *)state)->super_enable_shared_from_this<duckdb::ClientContext>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          p_Var1->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
          bVar11 = true;
        }
        else {
          for (uVar24 = 0;
              uVar24 < (ulong)((long)local_108._M_pi[0x1c]._vptr__Sp_counted_base -
                               *(long *)&local_108._M_pi[0x1b]._M_use_count >> 5);
              uVar24 = uVar24 + 1) {
            if ((!bVar11) ||
               (bVar10 = ScanFilterInfo::ColumnHasFilters((ScanFilterInfo *)local_100._M_i,uVar24),
               !bVar10)) {
              pvVar15 = vector<duckdb::StorageIndex,_true>::get<true>(local_f0,uVar24);
              if (pvVar15->index == 0xffffffffffffffff) {
                pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,uVar24);
                Vector::SetVectorType(pvVar19,FLAT_VECTOR);
                pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,uVar24);
                pdVar7 = pvVar19->data;
                for (uVar20 = 0; uVar20 < approved_tuple_count; uVar20 = uVar20 + 1) {
                  uVar22 = uVar20;
                  if (sel.sel_vector != (sel_t *)0x0) {
                    uVar22 = (ulong)sel.sel_vector[uVar20];
                  }
                  *(ulong *)(pdVar7 + uVar20 * 8) =
                       (long)&(peVar23->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + uVar22 + (this->super_SegmentBase<duckdb::RowGroup>).start;
                }
              }
              else {
                pCVar16 = GetColumn(this,pvVar15);
                p_Var3 = (local_110->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                _Var8._M_head_impl =
                     (((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                        *)&(local_110->db).internal.
                           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_t).
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar19 = vector<duckdb::Vector,_true>::get<true>(&local_118->data,uVar24);
                in_stack_fffffffffffffea8.ptr = in_stack_fffffffffffffea8.ptr & 0xffffffff00000000;
                (*pCVar16->_vptr_ColumnData[0xf])
                          (pCVar16,p_Var3,_Var8._M_head_impl + uVar24,pvVar19,&sel,
                           approved_tuple_count,in_stack_fffffffffffffea8.ptr);
              }
            }
          }
          ScanFilterInfo::EndFilter((ScanFilterInfo *)local_100._M_i,state_00);
          bVar11 = false;
          local_f8 = approved_tuple_count;
          state = (CollectionScanState *)local_110;
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sel.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        max_count = local_f8;
        if (iVar14 != 0) goto LAB_015687dd;
      }
    }
    else {
LAB_01568250:
      NextVector(this,state);
      bVar11 = true;
    }
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}